

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmMakefile *pcVar1;
  cmTarget *this;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  cmTarget *local_30;
  cmTarget *t;
  cmMakefile *mf;
  char *d_local;
  char *tgt_local;
  void *arg_local;
  
  t = (cmTarget *)arg;
  mf = (cmMakefile *)d;
  d_local = tgt;
  tgt_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,tgt,&local_51);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar1 = mf;
  local_30 = this;
  if (this == (cmTarget *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",d_local," for directory ",
               (char *)mf);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,(char *)pcVar1,&local_89);
    cmTarget::AddLinkDirectory(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: ", tgt,
      " for directory ", d);
    return;
  }
  t->AddLinkDirectory(d);
}